

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply_decoder.cc
# Opt level: O0

bool __thiscall
draco::PlyDecoder::ReadPropertiesToAttribute<float>
          (PlyDecoder *this,
          vector<const_draco::PlyProperty_*,_std::allocator<const_draco::PlyProperty_*>_>
          *properties,PointAttribute *attribute,int num_vertices)

{
  ulong uVar1;
  size_type sVar2;
  allocator_type *paVar3;
  reference pvVar4;
  uint in_ECX;
  PlyPropertyReader<float> *in_RDX;
  vector<const_draco::PlyProperty_*,_std::allocator<const_draco::PlyProperty_*>_> *in_RSI;
  float fVar5;
  int prop_1;
  ValueType i;
  vector<float,_std::allocator<float>_> memory;
  int prop;
  vector<std::unique_ptr<draco::PlyPropertyReader<float>,_std::default_delete<draco::PlyPropertyReader<float>_>_>,_std::allocator<std::unique_ptr<draco::PlyPropertyReader<float>,_std::default_delete<draco::PlyPropertyReader<float>_>_>_>_>
  readers;
  undefined4 in_stack_ffffffffffffff38;
  int in_stack_ffffffffffffff3c;
  PlyPropertyReader<float> *in_stack_ffffffffffffff40;
  allocator_type *in_stack_ffffffffffffff50;
  vector<float,_std::allocator<float>_> *this_00;
  GeometryAttribute *in_stack_ffffffffffffff68;
  vector<std::unique_ptr<draco::PlyPropertyReader<float>,_std::default_delete<draco::PlyPropertyReader<float>_>_>,_std::allocator<std::unique_ptr<draco::PlyPropertyReader<float>,_std::default_delete<draco::PlyPropertyReader<float>_>_>_>_>
  *in_stack_ffffffffffffff70;
  IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_> in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  int iVar6;
  undefined4 in_stack_ffffffffffffff90;
  uint value;
  undefined4 in_stack_ffffffffffffff94;
  vector<float,_std::allocator<float>_> local_68;
  undefined1 local_50 [52];
  uint local_1c;
  PlyPropertyReader<float> *local_18;
  vector<const_draco::PlyProperty_*,_std::allocator<const_draco::PlyProperty_*>_> *local_10;
  
  local_1c = in_ECX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::
  vector<std::unique_ptr<draco::PlyPropertyReader<float>,_std::default_delete<draco::PlyPropertyReader<float>_>_>,_std::allocator<std::unique_ptr<draco::PlyPropertyReader<float>,_std::default_delete<draco::PlyPropertyReader<float>_>_>_>_>
  ::vector((vector<std::unique_ptr<draco::PlyPropertyReader<float>,_std::default_delete<draco::PlyPropertyReader<float>_>_>,_std::allocator<std::unique_ptr<draco::PlyPropertyReader<float>,_std::default_delete<draco::PlyPropertyReader<float>_>_>_>_>
            *)0x131f48);
  std::vector<const_draco::PlyProperty_*,_std::allocator<const_draco::PlyProperty_*>_>::size
            (local_10);
  std::
  vector<std::unique_ptr<draco::PlyPropertyReader<float>,_std::default_delete<draco::PlyPropertyReader<float>_>_>,_std::allocator<std::unique_ptr<draco::PlyPropertyReader<float>,_std::default_delete<draco::PlyPropertyReader<float>_>_>_>_>
  ::reserve(in_stack_ffffffffffffff70,(size_type)in_stack_ffffffffffffff68);
  local_50._8_4_ = 0;
  while( true ) {
    uVar1 = (ulong)(int)local_50._8_4_;
    sVar2 = std::vector<const_draco::PlyProperty_*,_std::allocator<const_draco::PlyProperty_*>_>::
            size(local_10);
    if (sVar2 <= uVar1) break;
    in_stack_ffffffffffffff70 =
         (vector<std::unique_ptr<draco::PlyPropertyReader<float>,_std::default_delete<draco::PlyPropertyReader<float>_>_>,_std::allocator<std::unique_ptr<draco::PlyPropertyReader<float>,_std::default_delete<draco::PlyPropertyReader<float>_>_>_>_>
          *)operator_new(0x28);
    std::vector<const_draco::PlyProperty_*,_std::allocator<const_draco::PlyProperty_*>_>::operator[]
              (local_10,(long)(int)local_50._8_4_);
    PlyPropertyReader<float>::PlyPropertyReader
              ((PlyPropertyReader<float> *)
               CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
               (PlyProperty *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88.value_));
    in_stack_ffffffffffffff68 = (GeometryAttribute *)local_50;
    std::
    unique_ptr<draco::PlyPropertyReader<float>,std::default_delete<draco::PlyPropertyReader<float>>>
    ::unique_ptr<std::default_delete<draco::PlyPropertyReader<float>>,void>
              ((unique_ptr<draco::PlyPropertyReader<float>,_std::default_delete<draco::PlyPropertyReader<float>_>_>
                *)in_stack_ffffffffffffff40,
               (pointer)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    std::
    vector<std::unique_ptr<draco::PlyPropertyReader<float>,_std::default_delete<draco::PlyPropertyReader<float>_>_>,_std::allocator<std::unique_ptr<draco::PlyPropertyReader<float>,_std::default_delete<draco::PlyPropertyReader<float>_>_>_>_>
    ::push_back((vector<std::unique_ptr<draco::PlyPropertyReader<float>,_std::default_delete<draco::PlyPropertyReader<float>_>_>,_std::allocator<std::unique_ptr<draco::PlyPropertyReader<float>,_std::default_delete<draco::PlyPropertyReader<float>_>_>_>_>
                 *)in_stack_ffffffffffffff40,
                (value_type *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    std::
    unique_ptr<draco::PlyPropertyReader<float>,_std::default_delete<draco::PlyPropertyReader<float>_>_>
    ::~unique_ptr((unique_ptr<draco::PlyPropertyReader<float>,_std::default_delete<draco::PlyPropertyReader<float>_>_>
                   *)in_stack_ffffffffffffff40);
    local_50._8_4_ = local_50._8_4_ + 1;
  }
  sVar2 = std::vector<const_draco::PlyProperty_*,_std::allocator<const_draco::PlyProperty_*>_>::size
                    (local_10);
  this_00 = (vector<float,_std::allocator<float>_> *)&stack0xffffffffffffff97;
  std::allocator<float>::allocator((allocator<float> *)0x13209c);
  std::vector<float,_std::allocator<float>_>::vector(this_00,sVar2,in_stack_ffffffffffffff50);
  std::allocator<float>::~allocator((allocator<float> *)0x1320bc);
  for (value = 0; value < local_1c; value = value + 1) {
    iVar6 = 0;
    while( true ) {
      in_stack_ffffffffffffff50 = (allocator_type *)(long)iVar6;
      paVar3 = (allocator_type *)
               std::vector<const_draco::PlyProperty_*,_std::allocator<const_draco::PlyProperty_*>_>
               ::size(local_10);
      if (paVar3 <= in_stack_ffffffffffffff50) break;
      std::
      vector<std::unique_ptr<draco::PlyPropertyReader<float>,_std::default_delete<draco::PlyPropertyReader<float>_>_>,_std::allocator<std::unique_ptr<draco::PlyPropertyReader<float>,_std::default_delete<draco::PlyPropertyReader<float>_>_>_>_>
      ::operator[]((vector<std::unique_ptr<draco::PlyPropertyReader<float>,_std::default_delete<draco::PlyPropertyReader<float>_>_>,_std::allocator<std::unique_ptr<draco::PlyPropertyReader<float>,_std::default_delete<draco::PlyPropertyReader<float>_>_>_>_>
                    *)(local_50 + 0x18),(long)iVar6);
      std::
      unique_ptr<draco::PlyPropertyReader<float>,_std::default_delete<draco::PlyPropertyReader<float>_>_>
      ::operator->((unique_ptr<draco::PlyPropertyReader<float>,_std::default_delete<draco::PlyPropertyReader<float>_>_>
                    *)0x13211f);
      fVar5 = PlyPropertyReader<float>::ReadValue
                        (in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
      pvVar4 = std::vector<float,_std::allocator<float>_>::operator[](&local_68,(long)iVar6);
      *pvVar4 = fVar5;
      iVar6 = iVar6 + 1;
    }
    in_stack_ffffffffffffff40 = local_18;
    IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>::IndexType
              ((IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_> *)
               &stack0xffffffffffffff88,value);
    std::vector<float,_std::allocator<float>_>::data
              ((vector<float,_std::allocator<float>_> *)0x1321c3);
    GeometryAttribute::SetAttributeValue
              (in_stack_ffffffffffffff68,
               (AttributeValueIndex)(uint)((ulong)in_stack_ffffffffffffff70 >> 0x20),this_00);
  }
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)in_stack_ffffffffffffff50);
  std::
  vector<std::unique_ptr<draco::PlyPropertyReader<float>,_std::default_delete<draco::PlyPropertyReader<float>_>_>,_std::allocator<std::unique_ptr<draco::PlyPropertyReader<float>,_std::default_delete<draco::PlyPropertyReader<float>_>_>_>_>
  ::~vector((vector<std::unique_ptr<draco::PlyPropertyReader<float>,_std::default_delete<draco::PlyPropertyReader<float>_>_>,_std::allocator<std::unique_ptr<draco::PlyPropertyReader<float>,_std::default_delete<draco::PlyPropertyReader<float>_>_>_>_>
             *)in_stack_ffffffffffffff50);
  return true;
}

Assistant:

bool PlyDecoder::ReadPropertiesToAttribute(
    const std::vector<const PlyProperty *> &properties,
    PointAttribute *attribute, int num_vertices) {
  std::vector<std::unique_ptr<PlyPropertyReader<DataTypeT>>> readers;
  readers.reserve(properties.size());
  for (int prop = 0; prop < properties.size(); ++prop) {
    readers.push_back(std::unique_ptr<PlyPropertyReader<DataTypeT>>(
        new PlyPropertyReader<DataTypeT>(properties[prop])));
  }
  std::vector<DataTypeT> memory(properties.size());
  for (PointIndex::ValueType i = 0; i < static_cast<uint32_t>(num_vertices);
       ++i) {
    for (int prop = 0; prop < properties.size(); ++prop) {
      memory[prop] = readers[prop]->ReadValue(i);
    }
    attribute->SetAttributeValue(AttributeValueIndex(i), memory.data());
  }
  return true;
}